

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_ssi_filter_module.c
# Opt level: O0

ngx_int_t ngx_http_ssi_block(ngx_http_request_t *r,ngx_http_ssi_ctx_t *ctx,ngx_str_t **params)

{
  void *pvVar1;
  ngx_str_t *pnVar2;
  ngx_array_t *pnVar3;
  size_t *psVar4;
  ngx_http_ssi_block_t *bl;
  ngx_http_ssi_ctx_t *mctx;
  ngx_str_t **params_local;
  ngx_http_ssi_ctx_t *ctx_local;
  ngx_http_request_t *r_local;
  
  if ((r->connection->log->log_level & 0x100) != 0) {
    ngx_log_error_core(8,r->connection->log,0,"ssi block");
  }
  pvVar1 = r->main->ctx[ngx_http_ssi_filter_module.ctx_index];
  if (*(long *)((long)pvVar1 + 0x180) == 0) {
    pnVar3 = ngx_array_create(r->pool,4,0x20);
    *(ngx_array_t **)((long)pvVar1 + 0x180) = pnVar3;
    if (*(long *)((long)pvVar1 + 0x180) == 0) {
      r_local = (ngx_http_request_t *)&DAT_00000001;
      return (ngx_int_t)r_local;
    }
  }
  psVar4 = (size_t *)ngx_array_push(*(ngx_array_t **)((long)pvVar1 + 0x180));
  if (psVar4 == (size_t *)0x0) {
    r_local = (ngx_http_request_t *)&DAT_00000001;
  }
  else {
    pnVar2 = *params;
    *psVar4 = pnVar2->len;
    psVar4[1] = (size_t)pnVar2->data;
    psVar4[2] = 0;
    psVar4[3] = 0;
    ctx->field_0x1a0 = ctx->field_0x1a0 & 0xdf;
    ctx->field_0x1a0 = ctx->field_0x1a0 & 0xef | 0x10;
    r_local = (ngx_http_request_t *)0x0;
  }
  return (ngx_int_t)r_local;
}

Assistant:

static ngx_int_t
ngx_http_ssi_block(ngx_http_request_t *r, ngx_http_ssi_ctx_t *ctx,
    ngx_str_t **params)
{
    ngx_http_ssi_ctx_t    *mctx;
    ngx_http_ssi_block_t  *bl;

    ngx_log_debug0(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                   "ssi block");

    mctx = ngx_http_get_module_ctx(r->main, ngx_http_ssi_filter_module);

    if (mctx->blocks == NULL) {
        mctx->blocks = ngx_array_create(r->pool, 4,
                                        sizeof(ngx_http_ssi_block_t));
        if (mctx->blocks == NULL) {
            return NGX_HTTP_SSI_ERROR;
        }
    }

    bl = ngx_array_push(mctx->blocks);
    if (bl == NULL) {
        return NGX_HTTP_SSI_ERROR;
    }

    bl->name = *params[NGX_HTTP_SSI_BLOCK_NAME];
    bl->bufs = NULL;
    bl->count = 0;

    ctx->output = 0;
    ctx->block = 1;

    return NGX_OK;
}